

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::copytexsubimage3d_incomplete_framebuffer
               (NegativeTestContext *ctx)

{
  GLuint fbo;
  GLuint texture [2];
  string local_50;
  
  fbo = 0x1234;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,2,texture);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x806f,texture[0]);
  glu::CallLogWrapper::glTexImage3D
            (&ctx->super_CallLogWrapper,0x806f,0,0x1908,4,4,4,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8c1a,texture[1]);
  glu::CallLogWrapper::glTexImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,0x1908,4,4,4,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glGenFramebuffers(&ctx->super_CallLogWrapper,1,&fbo);
  glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8ca8,fbo);
  glu::CallLogWrapper::glCheckFramebufferStatus(&ctx->super_CallLogWrapper,0x8ca8);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glCopyTexSubImage3D(&ctx->super_CallLogWrapper,0x806f,0,0,0,0,0,0,4,4);
  NegativeTestContext::expectError(ctx,0x506);
  glu::CallLogWrapper::glCopyTexSubImage3D(&ctx->super_CallLogWrapper,0x8c1a,0,0,0,0,0,0,4,4);
  NegativeTestContext::expectError(ctx,0x506);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,0);
  glu::CallLogWrapper::glDeleteFramebuffers(&ctx->super_CallLogWrapper,1,&fbo);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,2,texture);
  return;
}

Assistant:

void copytexsubimage3d_incomplete_framebuffer (NegativeTestContext& ctx)
{
	GLuint fbo = 0x1234;
	GLuint texture[2];

	ctx.glGenTextures			(2, texture);
	ctx.glBindTexture			(GL_TEXTURE_3D, texture[0]);
	ctx.glTexImage3D			(GL_TEXTURE_3D, 0, GL_RGBA, 4, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.glBindTexture			(GL_TEXTURE_2D_ARRAY, texture[1]);
	ctx.glTexImage3D			(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, 4, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.glGenFramebuffers		(1, &fbo);
	ctx.glBindFramebuffer		(GL_READ_FRAMEBUFFER, fbo);
	ctx.glCheckFramebufferStatus(GL_READ_FRAMEBUFFER);

	ctx.beginSection("GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete.");
	ctx.glCopyTexSubImage3D(GL_TEXTURE_3D, 0, 0, 0, 0, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glCopyTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 0, 0, 0, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.endSection();

	ctx.glBindFramebuffer(GL_FRAMEBUFFER, 0);
	ctx.glDeleteFramebuffers(1, &fbo);
	ctx.glDeleteTextures(2, texture);
}